

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::ByteSizeLong
          (UniDirectionalLSTMLayerParams *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  uint64_t uVar3;
  size_t sVar4;
  long lVar5;
  int cached_size;
  ActivationParams *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  UniDirectionalLSTMLayerParams *this_local;
  
  iVar2 = _internal_activations_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                     (&this->activations_);
  msg = (ActivationParams *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                  (&this->activations_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*(&__end2);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ActivationParams>(value);
    sStack_18 = sVar4 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end2);
  }
  bVar1 = _internal_has_params(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LSTMParams>(this->params_);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  bVar1 = _internal_has_weightparams(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LSTMWeightParams>(this->weightparams_);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  uVar3 = _internal_inputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = _internal_inputvectorsize(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar3);
    sStack_18 = sVar4 + sStack_18;
  }
  uVar3 = _internal_outputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = _internal_outputvectorsize(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar3);
    sStack_18 = sVar4 + sStack_18;
  }
  bVar1 = _internal_reverseinput(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 3;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    sStack_18 = lVar5 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t UniDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  total_size += 1UL * this->_internal_activations_size();
  for (const auto& msg : this->activations_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *params_);
  }

  // .CoreML.Specification.LSTMWeightParams weightParams = 20;
  if (this->_internal_has_weightparams()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *weightparams_);
  }

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_outputvectorsize());
  }

  // bool reverseInput = 100;
  if (this->_internal_reverseinput() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}